

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizepolicy.h
# Opt level: O2

Bits __thiscall QSizePolicy::Bits::transposed(Bits *this)

{
  Bits BVar1;
  
  BVar1 = *this;
  return (Bits)((uint)BVar1 & 0xff000000 | (uint)BVar1 >> 4 & 0xf0000 | ((uint)BVar1 & 0xf0000) << 4
               | (uint)(ushort)(BVar1._0_2_ << 8 | BVar1._0_2_ >> 8));
}

Assistant:

constexpr Bits transposed() const noexcept
        {
            return {verStretch, // \ swap
                    horStretch, // /
                    verPolicy, // \ swap
                    horPolicy, // /
                    ctype,
                    hfw, // \ don't swap (historic behavior)
                    wfh, // /
                    retainSizeWhenHidden};
        }